

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createMaterial_uber(SemanticParser *this,SP *in)

{
  undefined1 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  SemanticParser *pSVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  runtime_error *prVar6;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vec3f *result;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  float fVar7;
  SP SVar8;
  SP mat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  SemanticParser *local_140;
  _Rb_tree_node_base *local_138;
  undefined1 local_130 [16];
  undefined1 local_120 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  undefined1 local_100 [16];
  undefined1 local_f0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  
  local_140 = this;
  std::make_shared<pbrt::UberMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat);
  p_Var5 = *(_Rb_tree_node_base **)(*in_RDX + 0x18);
  local_138 = (_Rb_tree_node_base *)(*in_RDX + 8);
  do {
    pSVar3 = local_140;
    _Var2._M_pi = mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    if (p_Var5 == local_138) {
      mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (local_140->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (local_140->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var2._M_pi;
      mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pSVar3;
      return (SP)SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(&it,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)(p_Var5 + 1));
    std::__cxx11::string::string((string *)&name,(string *)&it);
    bVar4 = std::operator==(&name,"Kd");
    if (bVar4) {
      bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
      if (!bVar4) {
        result = &(mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  kd;
        goto LAB_00139014;
      }
      ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kd).x = 1.0;
      ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kd).y = 1.0;
      ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kd).z = 1.0;
      syntactic::ParamSet::getParamTexture((ParamSet *)local_b0,(string *)*in_RDX);
      findOrCreateTexture((SemanticParser *)&local_160,(SP *)in);
      std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&local_160);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
    }
    else {
      bVar4 = std::operator==(&name,"Kr");
      if (bVar4) {
        bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
        if (!bVar4) {
          result = &(mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->kr;
          goto LAB_00139014;
        }
        ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kr).x =
             1.0;
        ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kr).y =
             1.0;
        ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kr).z =
             1.0;
        syntactic::ParamSet::getParamTexture((ParamSet *)local_c0,(string *)*in_RDX);
        findOrCreateTexture((SemanticParser *)&local_160,(SP *)in);
        std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->map_kr).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&local_160);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
      }
      else {
        bVar4 = std::operator==(&name,"Kt");
        if (bVar4) {
          bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
          if (bVar4) {
            ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kt).x
                 = 1.0;
            ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kt).y
                 = 1.0;
            ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kt).z
                 = 1.0;
            syntactic::ParamSet::getParamTexture((ParamSet *)local_d0,(string *)*in_RDX);
            findOrCreateTexture((SemanticParser *)&local_160,(SP *)in);
            std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->map_kt).
                        super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&local_160);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
            this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8);
LAB_00138e9f:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
          }
          else {
            result = &(mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->kt;
LAB_00139014:
            syntactic::ParamSet::getParam3f((ParamSet *)*in_RDX,&result->x,&name);
          }
        }
        else {
          bVar4 = std::operator==(&name,"Ks");
          if (bVar4) {
            bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
            if (bVar4) {
              ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ks).
              x = 1.0;
              ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ks).
              y = 1.0;
              ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ks).
              z = 1.0;
              syntactic::ParamSet::getParamTexture((ParamSet *)(local_f0 + 0x10),(string *)*in_RDX);
              findOrCreateTexture((SemanticParser *)&local_160,(SP *)in);
              std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (&((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->map_ks).
                          super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                         (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&local_160);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
              this_00 = &local_d8;
              goto LAB_00138e9f;
            }
            result = &(mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->ks;
            goto LAB_00139014;
          }
          bVar4 = std::operator==(&name,"alpha");
          if (bVar4) {
            bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
            if (bVar4) {
              (mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->alpha
                   = 1.0;
              syntactic::ParamSet::getParamTexture((ParamSet *)local_f0,(string *)*in_RDX);
              findOrCreateTexture((SemanticParser *)&local_160,(SP *)in);
              std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (&((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->map_alpha).
                          super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                         (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&local_160);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
              puVar1 = local_f0;
LAB_00138f4a:
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 8));
            }
            else {
              fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
              (mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->alpha
                   = fVar7;
            }
          }
          else {
            bVar4 = std::operator==(&name,"opacity");
            if (bVar4) {
              bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
              if (bVar4) {
                ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                opacity).x = 1.0;
                ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                opacity).y = 1.0;
                ((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                opacity).z = 1.0;
                syntactic::ParamSet::getParamTexture((ParamSet *)local_100,(string *)*in_RDX);
                findOrCreateTexture((SemanticParser *)&local_160,(SP *)in);
                std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                          (&((mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->map_opacity).
                            super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                           (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&local_160);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length
                          );
                this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8);
                goto LAB_00138e9f;
              }
              result = &(mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->opacity;
              goto LAB_00139014;
            }
            bVar4 = std::operator==(&name,"index");
            if (bVar4) {
              fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
              (mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->index
                   = fVar7;
            }
            else {
              bVar4 = std::operator==(&name,"roughness");
              if (bVar4) {
                bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
                if (bVar4) {
                  syntactic::ParamSet::getParamTexture
                            ((ParamSet *)(local_120 + 0x10),(string *)*in_RDX);
                  findOrCreateTexture((SemanticParser *)&local_160,(SP *)in);
                  std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                            (&((mat.
                                super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->map_roughness).
                              super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                             (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&local_160);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &local_160._M_string_length);
                  this_00 = &local_108;
                  goto LAB_00138e9f;
                }
                bVar4 = syntactic::ParamSet::hasParam1f((ParamSet *)*in_RDX,&name);
                if (!bVar4) {
                  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar6,"uber::roughness in un-recognized format...");
                  __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
                (mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                roughness = fVar7;
              }
              else {
                bVar4 = std::operator==(&name,"uroughness");
                if (bVar4) {
                  fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
                  (mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  uRoughness = fVar7;
                }
                else {
                  bVar4 = std::operator==(&name,"vroughness");
                  if (bVar4) {
                    fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
                    (mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->vRoughness = fVar7;
                  }
                  else {
                    bVar4 = std::operator==(&name,"shadowalpha");
                    if (bVar4) {
                      bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
                      if (bVar4) {
                        (mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->shadowAlpha = 1.0;
                        syntactic::ParamSet::getParamTexture
                                  ((ParamSet *)local_120,(string *)*in_RDX);
                        findOrCreateTexture((SemanticParser *)&local_160,(SP *)in);
                        std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                                  (&((mat.
                                      super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->map_shadowAlpha).
                                    super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                                   (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)
                                   &local_160);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                   &local_160._M_string_length);
                        puVar1 = local_120;
                        goto LAB_00138f4a;
                      }
                      fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
                      (mat.super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->shadowAlpha = fVar7;
                    }
                    else {
                      bVar4 = std::operator==(&name,"bumpmap");
                      if (bVar4) {
                        syntactic::ParamSet::getParamTexture
                                  ((ParamSet *)local_130,(string *)*in_RDX);
                        findOrCreateTexture((SemanticParser *)&local_160,(SP *)in);
                        std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                                  (&((mat.
                                      super___shared_ptr<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->map_bump).
                                    super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                                   (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)
                                   &local_160);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                   &local_160._M_string_length);
                        this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_130 + 8);
                        goto LAB_00138e9f;
                      }
                      bVar4 = std::operator==(&name,"type");
                      if (!bVar4) {
                        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::operator+(&local_a0,"un-handled uber-material parameter \'",&it.first);
                        std::operator+(&local_160,&local_a0,"\'");
                        std::runtime_error::runtime_error(prVar6,(string *)&local_160);
                        __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(&it);
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_uber(pbrt::syntactic::Material::SP in)
  {
    UberMaterial::SP mat = std::make_shared<UberMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "Kd") {
        if (in->hasParamTexture(name)) {
          mat->kd = vec3f(1.f);
          mat->map_kd = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kd.x,name);
      }
      else if (name == "Kr") {
        if (in->hasParamTexture(name)) {
          mat->kr = vec3f(1.f);
          mat->map_kr = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kr.x,name);
      }
      else if (name == "Kt") {
        if (in->hasParamTexture(name)) {
          mat->kt = vec3f(1.f);
          mat->map_kt = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kt.x,name);
      }
      else if (name == "Ks") {
        if (in->hasParamTexture(name)) {
          mat->ks = vec3f(1.f);
          mat->map_ks = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->ks.x,name);
      }
      else if (name == "alpha") {
        if (in->hasParamTexture(name)) {
          mat->alpha = 1.f;
          mat->map_alpha = findOrCreateTexture(in->getParamTexture(name));
        } else
          mat->alpha = in->getParam1f(name);
      }
      else if (name == "opacity") {
        if (in->hasParamTexture(name)) {
          mat->opacity = vec3f(1.f);
          mat->map_opacity = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->opacity.x,name);
      }
      else if (name == "index") {
        mat->index = in->getParam1f(name);
      }
      else if (name == "roughness") {
        if (in->hasParamTexture(name))
          mat->map_roughness = findOrCreateTexture(in->getParamTexture(name));
        else if (in->hasParam1f(name))
          mat->roughness = in->getParam1f(name);
        else
          throw std::runtime_error("uber::roughness in un-recognized format...");
        // else
        //   in->getParam3f(&mat->roughness.x,name);
      }
      else if (name == "uroughness") {
        // if (in->hasParamTexture(name))
        //   mat->map_uRoughness = findOrCreateTexture(in->getParamTexture(name));
        // else
          mat->uRoughness = in->getParam1f(name);
      }
      else if (name == "vroughness") {
        // if (in->hasParamTexture(name))
        //   mat->map_vRoughness = findOrCreateTexture(in->getParamTexture(name));
        // else
          mat->vRoughness = in->getParam1f(name);
      }
      // else if (name == "remaproughness") {
      //   mat->remapRoughness = in->getParamBool(name);
      // }
      else if (name == "shadowalpha") {
        if (in->hasParamTexture(name)) {
          mat->shadowAlpha = 1.f;
          mat->map_shadowAlpha = findOrCreateTexture(in->getParamTexture(name));
        } else
          mat->shadowAlpha = in->getParam1f(name);
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled uber-material parameter '"+it.first+"'");
    };
    return mat;
  }